

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_15712b::ExprComparator::VisitImplication(ExprComparator *this,ImplicationExpr e)

{
  Impl *pIVar1;
  bool bVar2;
  Impl *pIVar3;
  
  pIVar1 = (this->expr_).super_ExprBase.impl_;
  pIVar3 = (Impl *)0x0;
  if (pIVar1->kind_ == IMPLICATION) {
    pIVar3 = pIVar1;
  }
  bVar2 = mp::Equal((ExprBase)*(ExprBase *)&pIVar3[2].kind_,
                    (Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                 super_ExprBase.impl_ + 8))->impl_);
  if (bVar2) {
    bVar2 = mp::Equal((ExprBase)*(ExprBase *)&pIVar3[4].kind_,
                      (Expr)((ExprBase *)
                            ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                   super_ExprBase.impl_ + 0x10))->impl_);
    if (bVar2) {
      bVar2 = mp::Equal((ExprBase)*(ExprBase *)&pIVar3[6].kind_,
                        (Expr)((ExprBase *)
                              ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                     super_ExprBase.impl_ + 0x18))->impl_);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool VisitImplication(ImplicationExpr e) { return VisitIf(e); }